

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

void __thiscall
QSequentialAnimationGroup::updateCurrentTime(QSequentialAnimationGroup *this,int currentTime)

{
  QBindingStorage *this_00;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *data;
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
  *this_01;
  int *piVar1;
  int iVar2;
  QSequentialAnimationGroupPrivate *this_02;
  QBindingStatus *pQVar3;
  Data *pDVar4;
  bool bVar5;
  parameter_type pVar6;
  parameter_type pVar7;
  long lVar8;
  int iVar9;
  long in_FS_OFFSET;
  AnimationIndex newAnimationIndex;
  AnimationIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QSequentialAnimationGroupPrivate **)(this + 8);
  data = &this_02->currentAnimation;
  this_00 = &(this_02->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage;
  pQVar3 = (this_02->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
           super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar3 != (QBindingStatus *)0x0) &&
     (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
  }
  if ((data->super_QPropertyData<QAbstractAnimation_*>).val == (QAbstractAnimation *)0x0)
  goto LAB_003ba8eb;
  local_40 = (AnimationIndex)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QSequentialAnimationGroupPrivate::indexForCurrentTime(this_02);
  iVar9 = local_40.index;
  if ((long)iVar9 < (this_02->actualDuration).d.size) {
    do {
      pDVar4 = (this_02->actualDuration).d.d;
      if ((pDVar4 == (Data *)0x0) ||
         (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QArrayDataPointer<int>::reallocateAndGrow
                  (&(this_02->actualDuration).d,GrowsAtEnd,0,(QArrayDataPointer<int> *)0x0);
      }
      lVar8 = (this_02->actualDuration).d.size + -1;
      (this_02->actualDuration).d.size = lVar8;
    } while (iVar9 < lVar8);
  }
  iVar2 = this_02->lastLoop;
  this_01 = &(this_02->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentLoop;
  pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
          ::value(this_01);
  if (iVar2 < pVar6) {
LAB_003ba7bb:
    QSequentialAnimationGroupPrivate::advanceForwards(this_02,&local_40);
  }
  else {
    iVar2 = this_02->lastLoop;
    pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
            ::value(this_01);
    if ((iVar2 == pVar6) && (this_02->currentAnimationIndex < iVar9)) goto LAB_003ba7bb;
    iVar2 = this_02->lastLoop;
    pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
            ::value(this_01);
    if (pVar6 < iVar2) {
LAB_003ba7fb:
      QSequentialAnimationGroupPrivate::rewindForwards(this_02,&local_40);
    }
    else {
      iVar2 = this_02->lastLoop;
      pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
              ::value(this_01);
      if ((iVar2 == pVar6) && (iVar9 < this_02->currentAnimationIndex)) goto LAB_003ba7fb;
    }
  }
  QSequentialAnimationGroupPrivate::setCurrentAnimation(this_02,iVar9,false);
  iVar9 = currentTime - local_40.timeOffset;
  pQVar3 = (this_02->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
           super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar3 != (QBindingStatus *)0x0) &&
     (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
  }
  if ((data->super_QPropertyData<QAbstractAnimation_*>).val == (QAbstractAnimation *)0x0) {
    (this_02->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime = 0;
LAB_003ba8d3:
    QAbstractAnimation::stop((QAbstractAnimation *)this);
  }
  else {
    pQVar3 = (this_02->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    if ((pQVar3 != (QBindingStatus *)0x0) &&
       (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
    }
    QAbstractAnimation::setCurrentTime
              ((QAbstractAnimation *)
               (this_02->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val,iVar9);
    bVar5 = QSequentialAnimationGroupPrivate::atEnd(this_02);
    if (bVar5) {
      pQVar3 = (this_02->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
               super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
      if ((pQVar3 != (QBindingStatus *)0x0) &&
         (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
      }
      pVar7 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                       *)&(((this_02->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.
                           val)->super_QObject).d_ptr.d[1].field_0x30);
      piVar1 = &(this_02->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime;
      *piVar1 = *piVar1 + (pVar7 - iVar9);
      goto LAB_003ba8d3;
    }
  }
  pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
          ::value(this_01);
  this_02->lastLoop = pVar6;
LAB_003ba8eb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSequentialAnimationGroup::updateCurrentTime(int currentTime)
{
    Q_D(QSequentialAnimationGroup);
    if (!d->currentAnimation)
        return;

    const QSequentialAnimationGroupPrivate::AnimationIndex newAnimationIndex = d->indexForCurrentTime();

    // remove unneeded animations from actualDuration list
    while (newAnimationIndex.index < d->actualDuration.size())
        d->actualDuration.removeLast();

    // newAnimationIndex.index is the new current animation
    if (d->lastLoop < d->currentLoop
        || (d->lastLoop == d->currentLoop && d->currentAnimationIndex < newAnimationIndex.index)) {
            // advancing with forward direction is the same as rewinding with backwards direction
            d->advanceForwards(newAnimationIndex);
    } else if (d->lastLoop > d->currentLoop
        || (d->lastLoop == d->currentLoop && d->currentAnimationIndex > newAnimationIndex.index)) {
            // rewinding with forward direction is the same as advancing with backwards direction
            d->rewindForwards(newAnimationIndex);
    }

    d->setCurrentAnimation(newAnimationIndex.index);

    const int newCurrentTime = currentTime - newAnimationIndex.timeOffset;

    if (d->currentAnimation) {
        d->currentAnimation->setCurrentTime(newCurrentTime);
        if (d->atEnd()) {
            //we make sure that we don't exceed the duration here
            d->currentTime += QAbstractAnimationPrivate::get(d->currentAnimation)->totalCurrentTime - newCurrentTime;
            stop();
        }
    } else {
        //the only case where currentAnimation could be null
        //is when all animations have been removed
        Q_ASSERT(d->animations.isEmpty());
        d->currentTime = 0;
        stop();
    }

    d->lastLoop = d->currentLoop;
}